

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter_tree.cc
# Opt level: O2

void __thiscall re2::PrefilterTree::PrintPrefilter(PrefilterTree *this,int regexpid)

{
  string local_1b0;
  LogMessage local_190;
  
  LogMessage::LogMessage
            (&local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter_tree.cc"
             ,0x15d);
  DebugNodeString_abi_cxx11_
            (&local_1b0,this,
             (this->prefilter_vec_).
             super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>._M_impl.
             super__Vector_impl_data._M_start[regexpid]);
  std::operator<<((ostream *)&local_190.str_,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  LogMessage::~LogMessage(&local_190);
  return;
}

Assistant:

void PrefilterTree::PrintPrefilter(int regexpid) {
  LOG(ERROR) << DebugNodeString(prefilter_vec_[regexpid]);
}